

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void i4_to_triangle(int k,int *i,int *j)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  
  if (-1 < k) {
    if (k == 0) {
      iVar4 = 0;
      iVar3 = 0;
    }
    else {
      iVar4 = k * 2 + 2;
      dVar5 = (double)iVar4;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      iVar1 = (int)dVar5;
      iVar3 = iVar1 + 1;
      if (iVar4 <= (iVar1 + 1) * iVar1) {
        iVar3 = iVar1;
      }
      iVar4 = iVar3 + -1;
      iVar3 = k - (iVar3 * iVar4) / 2;
    }
    *i = iVar4;
    *j = iVar3;
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"I4_TO_TRIANGLE - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  K < 0.\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"  K = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,k);
  std::operator<<(poVar2,"\n");
  exit(1);
}

Assistant:

void i4_to_triangle ( int k, int *i, int *j )

//****************************************************************************80
//
//  Purpose:
//
//    I4_TO_TRIANGLE converts an integer to triangular coordinates.
//
//  Discussion:
//
//    Triangular coordinates are handy when storing a naturally triangular
//    array (such as the lower half of a matrix) in a linear array.
//
//    Thus, for example, we might consider storing
//
//    (0,0)
//    (1,0) (1,1)
//    (2,0) (2,1) (2,2)
//    (3,0) (3,1) (3,2) (3,3)
//
//    as the linear array
//
//    (0,0) (1,0) (1,1) (2,0) (2,1) (2,2) (3,0) (3,1) (3,2) (3,3)
//
//    Here, the quantities in parenthesis represent the natural row and
//    column indices of a single number when stored in a rectangular array.
//
//    In this routine, we are given the location K of an item in the
//    linear array, and wish to determine the row I and column J
//    of the item when stored in the triangular array.
//
//  Example:
//
//    K  I  J
//
//    0  0  0
//    1  1  0
//    2  1  1
//    3  2  0
//    4  2  1
//    5  2  2
//    6  3  0
//    7  3  1
//    8  3  2
//    9  3  3
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 January 2009
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int K, the linear index of the (I,J) element, which
//    must be nonnegative.
//
//    Output, int *I, *J, the row and column indices.
//
{
  int c;
  int r;

  if ( k < 0 )
  {
    std::cerr << "\n";
    std::cerr << "I4_TO_TRIANGLE - Fatal error!\n";
    std::cerr << "  K < 0.\n";
    std::cerr << "  K = " << k << "\n";
    exit ( 1 );
  }
  else if ( k == 0 )
  {
    *i = 0;
    *j = 0;
    return;
  }
//
//   ( N - 1 )^2 + ( N - 1 ) < 2 * K <= N^2 + N
//
  r = int( sqrt ( double( 2 * ( k + 1 ) ) ) );

  if ( r * r + r < 2 * ( k + 1 ) )
  {
    r = r + 1;
  }

  r = r - 1;

  c = k - ( r * ( r + 1 ) ) / 2;

  *i = r;
  *j = c;

  return;
}